

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

void __thiscall duckdb::Serializer::WriteValue<bool>(Serializer *this,vector<bool,_true> *vec)

{
  uint uVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong *puVar6;
  
  (*this->_vptr_Serializer[8])
            (this,(ulong)(vec->super_vector<bool,_std::allocator<bool>_>).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_finish.super__Bit_iterator_base._M_offset +
                  ((long)(vec->super_vector<bool,_std::allocator<bool>_>).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_finish.super__Bit_iterator_base._M_p -
                  (long)(vec->super_vector<bool,_std::allocator<bool>_>).
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                        _M_start.super__Bit_iterator_base._M_p) * 8);
  puVar6 = (vec->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p;
  puVar2 = (vec->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_p;
  uVar1 = (vec->super_vector<bool,_std::allocator<bool>_>).
          super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
          super__Bit_iterator_base._M_offset;
  uVar5 = 0;
  while ((uVar4 = (uint)uVar5, puVar6 != puVar2 || (uVar4 != uVar1))) {
    (*this->_vptr_Serializer[0xe])(this,(ulong)((*puVar6 >> (uVar5 & 0x3f) & 1) != 0));
    uVar3 = uVar4 + 1;
    puVar6 = puVar6 + (uVar4 == 0x3f);
    if (uVar4 == 0x3f) {
      uVar3 = 0;
    }
    uVar5 = (ulong)uVar3;
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void Serializer::WriteValue(const vector<bool> &vec) {
	auto count = vec.size();
	OnListBegin(count);
	for (auto item : vec) {
		WriteValue(item);
	}
	OnListEnd();
}